

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoration_manager.cpp
# Opt level: O1

bool __thiscall
spvtools::opt::analysis::DecorationManager::AreDecorationsTheSame
          (DecorationManager *this,Instruction *inst1,Instruction *inst2,bool ignore_target)

{
  Op OVar1;
  bool bVar2;
  uint uVar3;
  Operand *pOVar4;
  Operand *pOVar5;
  uint uVar6;
  bool bVar7;
  
  OVar1 = inst1->opcode_;
  if ((((OVar1 - OpDecorate < 2) || (OVar1 == OpDecorateString)) || (OVar1 == OpDecorateId)) &&
     (OVar1 == inst2->opcode_)) {
    uVar3 = (inst1->has_result_id_ & 1) + 1;
    if (inst1->has_type_id_ == false) {
      uVar3 = (uint)inst1->has_result_id_;
    }
    uVar6 = (inst2->has_result_id_ & 1) + 1;
    if (inst2->has_type_id_ == false) {
      uVar6 = (uint)inst2->has_result_id_;
    }
    if ((int)((ulong)((long)(inst1->operands_).
                            super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(inst1->operands_).
                           super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x55555555 - uVar3 ==
        (int)((ulong)((long)(inst2->operands_).
                            super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(inst2->operands_).
                           super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x55555555 - uVar6) {
      uVar3 = (inst1->has_result_id_ & 1) + 1;
      if (inst1->has_type_id_ == false) {
        uVar3 = (uint)inst1->has_result_id_;
      }
      uVar3 = (int)((ulong)((long)(inst1->operands_).
                                  super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(inst1->operands_).
                                 super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x55555555 -
              uVar3;
      bVar7 = uVar3 <= ignore_target;
      if (uVar3 <= ignore_target) {
        return bVar7;
      }
      uVar3 = (uint)ignore_target;
      pOVar4 = Instruction::GetInOperand(inst1,uVar3);
      pOVar5 = Instruction::GetInOperand(inst2,uVar3);
      if (pOVar4->type != pOVar5->type) {
        return bVar7;
      }
      while( true ) {
        uVar3 = uVar3 + 1;
        bVar2 = utils::operator==(&pOVar4->words,&pOVar5->words);
        if (!bVar2) {
          return bVar7;
        }
        uVar6 = (inst1->has_result_id_ & 1) + 1;
        if (inst1->has_type_id_ == false) {
          uVar6 = (uint)inst1->has_result_id_;
        }
        bVar7 = (int)((ulong)((long)(inst1->operands_).
                                    super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(inst1->operands_).
                                   super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x55555555 -
                uVar6 <= uVar3;
        if (bVar7) break;
        pOVar4 = Instruction::GetInOperand(inst1,uVar3);
        pOVar5 = Instruction::GetInOperand(inst2,uVar3);
        if (pOVar4->type != pOVar5->type) {
          return bVar7;
        }
      }
      return bVar7;
    }
  }
  return false;
}

Assistant:

bool DecorationManager::AreDecorationsTheSame(const Instruction* inst1,
                                              const Instruction* inst2,
                                              bool ignore_target) const {
  switch (inst1->opcode()) {
    case spv::Op::OpDecorate:
    case spv::Op::OpMemberDecorate:
    case spv::Op::OpDecorateId:
    case spv::Op::OpDecorateStringGOOGLE:
      break;
    default:
      return false;
  }

  if (inst1->opcode() != inst2->opcode() ||
      inst1->NumInOperands() != inst2->NumInOperands())
    return false;

  for (uint32_t i = ignore_target ? 1u : 0u; i < inst1->NumInOperands(); ++i)
    if (inst1->GetInOperand(i) != inst2->GetInOperand(i)) return false;

  return true;
}